

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O2

void writeVTKfileFor2DintegerField(char *fileName,char *description,char **field,lattice *grid)

{
  FILE *__s;
  int i;
  long lVar1;
  int j;
  long lVar2;
  double dVar3;
  
  __s = fopen(fileName,"w");
  if (__s != (FILE *)0x0) {
    fwrite("# vtk DataFile Version 3.0\n",0x1b,1,__s);
    fwrite("Scalar Field\n",0xd,1,__s);
    fwrite("ASCII\n",6,1,__s);
    fwrite("DATASET RECTILINEAR_GRID\n",0x19,1,__s);
    fprintf(__s,"DIMENSIONS %d %d 1\n",(ulong)(uint)grid->imax,(ulong)(uint)grid->jmax);
    fprintf(__s,"X_COORDINATES %d double\n",(ulong)(uint)grid->imax);
    for (dVar3 = 0.0; dVar3 < (double)grid->imax; dVar3 = dVar3 + 1.0) {
      fprintf(__s,"%lf ",grid->delx * dVar3);
    }
    fputc(10,__s);
    fprintf(__s,"Y_COORDINATES %d double\n",(ulong)(uint)grid->jmax);
    for (dVar3 = 0.0; dVar3 < (double)grid->jmax; dVar3 = dVar3 + 1.0) {
      fprintf(__s,"%lf ",grid->dely * dVar3);
    }
    fputc(10,__s);
    fwrite("Z_COORDINATES 1 double\n",0x17,1,__s);
    fwrite("0.0\n",4,1,__s);
    fprintf(__s,"POINT_DATA %d\n",(ulong)(uint)(grid->jmax * grid->imax));
    fprintf(__s,"SCALARS %s double 1\n",description);
    fwrite("LOOKUP_TABLE default\n",0x15,1,__s);
    for (lVar2 = 0; lVar2 < grid->delj; lVar2 = lVar2 + 1) {
      for (lVar1 = 0; lVar1 < grid->deli; lVar1 = lVar1 + 1) {
        fprintf(__s,"%i\n",(ulong)(field[lVar1][lVar2] != '\x0f'));
      }
    }
    fputc(10,__s);
    fclose(__s);
    return;
  }
  return;
}

Assistant:

void writeVTKfileFor2DintegerField (const char* fileName, const char* description, char **field, lattice *grid)
{
	FILE* vtkFile = fopen(fileName, "w");
	if (vtkFile == NULL)
		return;

	fprintf(vtkFile, "# vtk DataFile Version 3.0\n");
	fprintf(vtkFile, "Scalar Field\n");
	fprintf(vtkFile, "ASCII\n");

	fprintf(vtkFile, "DATASET RECTILINEAR_GRID\n");
	fprintf(vtkFile, "DIMENSIONS %d %d 1\n", grid->imax, grid->jmax);
	fprintf(vtkFile, "X_COORDINATES %d double\n", grid->imax);
	for (REAL i = 0; i < grid->imax; i++)
		fprintf(vtkFile, "%lf ", grid->delx*i);
	fprintf(vtkFile, "\n");
	fprintf(vtkFile, "Y_COORDINATES %d double\n", grid->jmax);
	for (REAL j = 0; j < grid->jmax; j++)
		fprintf(vtkFile, "%lf ", grid->dely*j);
	fprintf(vtkFile, "\n");
	fprintf(vtkFile, "Z_COORDINATES 1 double\n");
	fprintf(vtkFile, "0.0\n");

	fprintf(vtkFile, "POINT_DATA %d\n", grid->imax * grid->jmax);
	fprintf(vtkFile, "SCALARS %s double 1\n", description);
	fprintf(vtkFile, "LOOKUP_TABLE default\n");
	for(int j = 0; j < grid->delj; j++)
	{
		for(int i = 0; i < grid->deli; i++)
		{
			fprintf(vtkFile, "%i\n", (field[i][j]!=C_F));
		}
	}
	fprintf(vtkFile,"\n");
	fclose(vtkFile);
	return;
}